

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,4>
          (Matrix<float,_4,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Matrix<float,_4,_3> *res;
  int r;
  float *pfVar9;
  Vector<float,_4> *pVVar10;
  long lVar11;
  int row;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  bool bVar16;
  undefined4 uVar17;
  Matrix<float,_3,_4> retVal;
  long lVar15;
  
  res = __return_storage_ptr__;
  pfVar9 = (float *)&retVal;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  lVar11 = 0;
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      uVar17 = 0x3f800000;
      if (lVar11 != lVar13) {
        uVar17 = 0;
      }
      *(undefined4 *)((long)pfVar9 + lVar13) = uVar17;
      lVar13 = lVar13 + 0xc;
    } while (lVar13 != 0x30);
    lVar12 = lVar12 + 1;
    pfVar9 = pfVar9 + 1;
    lVar11 = lVar11 + 0xc;
  } while (lVar12 != 3);
  fVar3 = *(float *)this;
  fVar4 = *(float *)(this + 4);
  fVar5 = *(float *)(this + 8);
  fVar6 = *(float *)(this + 0xc);
  lVar11 = 0;
  do {
    fVar1 = a->m_data[lVar11];
    retVal.m_data.m_data[0].m_data[lVar11] = fVar1 * fVar3;
    retVal.m_data.m_data[1].m_data[lVar11] = fVar1 * fVar4;
    retVal.m_data.m_data[2].m_data[lVar11] = fVar1 * fVar5;
    retVal.m_data.m_data[3].m_data[lVar11] = fVar1 * fVar6;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar10 = (__return_storage_ptr__->m_data).m_data;
  pVVar10[2].m_data[2] = 0.0;
  pVVar10[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar10 = (__return_storage_ptr__->m_data).m_data;
  pVVar10[1].m_data[2] = 0.0;
  pVVar10[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar8 = _DAT_019fcc00;
  auVar7 = _DAT_019f5ce0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar10 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar11 = 0;
  lVar12 = 0;
  do {
    lVar13 = 0;
    auVar14 = auVar8;
    do {
      bVar16 = SUB164(auVar14 ^ auVar7,4) == -0x80000000 && SUB164(auVar14 ^ auVar7,0) < -0x7ffffffd
      ;
      if (bVar16) {
        uVar17 = 0x3f800000;
        if (lVar11 != lVar13) {
          uVar17 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar10 + -1))->m_data[0].m_data + lVar13) =
             uVar17;
      }
      if (bVar16) {
        uVar17 = 0x3f800000;
        if (lVar11 + -0x10 != lVar13) {
          uVar17 = 0;
        }
        *(undefined4 *)((long)pVVar10->m_data + lVar13) = uVar17;
      }
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar15 + 2;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x40);
    lVar12 = lVar12 + 1;
    lVar11 = lVar11 + 0x10;
    pVVar10 = (Vector<float,_4> *)(pVVar10->m_data + 1);
  } while (lVar12 != 4);
  lVar11 = 0;
  do {
    uVar17 = *(undefined4 *)((long)retVal.m_data.m_data[2].m_data + lVar11);
    uVar2 = *(undefined4 *)((long)retVal.m_data.m_data[3].m_data + lVar11);
    pfVar9 = (__return_storage_ptr__->m_data).m_data[0].m_data + lVar11;
    *(ulong *)pfVar9 =
         CONCAT44(*(undefined4 *)((long)retVal.m_data.m_data[1].m_data + lVar11),
                  *(undefined4 *)((long)retVal.m_data.m_data[0].m_data + lVar11));
    *(ulong *)(pfVar9 + 2) = CONCAT44(uVar2,uVar17);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0xc);
  return res;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}